

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_symbols.h
# Opt level: O2

MinusSignMatcher * __thiscall
icu_63::numparse::impl::MinusSignMatcher::operator=
          (MinusSignMatcher *this,MinusSignMatcher *param_1)

{
  SymbolMatcher::operator=(&this->super_SymbolMatcher,&param_1->super_SymbolMatcher);
  this->fAllowTrailing = param_1->fAllowTrailing;
  return this;
}

Assistant:

class U_I18N_API MinusSignMatcher : public SymbolMatcher {
  public:
    MinusSignMatcher() = default;  // WARNING: Leaves the object in an unusable state

    MinusSignMatcher(const DecimalFormatSymbols& dfs, bool allowTrailing);

  protected:
    bool isDisabled(const ParsedNumber& result) const override;

    void accept(StringSegment& segment, ParsedNumber& result) const override;

  private:
    bool fAllowTrailing;
}